

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::OpenBuildFileStream(cmGlobalNinjaGenerator *this)

{
  pointer pcVar1;
  Encoding encoding;
  string *psVar2;
  cmGeneratedFileStream *pcVar3;
  string buildFilePath;
  string local_38;
  
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_38);
  std::__cxx11::string::append((char *)&local_38);
  if (this->BuildFileStream == (cmGeneratedFileStream *)0x0) {
    pcVar3 = (cmGeneratedFileStream *)operator_new(0x248);
    encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[5])(this);
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar3,&local_38,false,encoding);
    this->BuildFileStream = pcVar3;
  }
  WriteDisclaimer(this,(ostream *)this->BuildFileStream);
  pcVar3 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"# This file contains all the build statements describing the\n",0x3d
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"# compilation DAG.\n\n",0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenBuildFileStream()
{
  // Compute Ninja's build file path.
  std::string buildFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  buildFilePath += "/";
  buildFilePath += cmGlobalNinjaGenerator::NINJA_BUILD_FILE;

  // Get a stream where to generate things.
  if (!this->BuildFileStream) {
    this->BuildFileStream = new cmGeneratedFileStream(
      buildFilePath, false, this->GetMakefileEncoding());
    if (!this->BuildFileStream) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->BuildFileStream);

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";
}